

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::single_query_and_learn
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,example *ec)

{
  polylabel *ppVar1;
  uint cn_00;
  node *pnVar2;
  double dVar3;
  label_t unaff_RBP;
  float fVar4;
  float fVar5;
  float fVar6;
  uint32_t cn;
  labels multilabels;
  v_array<unsigned_int> path_to_leaf;
  labels preds;
  uint local_9c;
  label_t local_98;
  wclass *pwStack_90;
  wclass *local_88;
  size_t sStack_80;
  v_array<unsigned_int> local_78;
  float *local_58;
  float *pfStack_50;
  float *local_48;
  size_t sStack_40;
  
  local_78.end_array = (uint *)0x0;
  local_78.erase_count = 0;
  local_78._begin = (uint *)0x0;
  local_78._end = (uint *)0x0;
  route_to_leaf(b,base,ec_array_index,0,&local_78,false);
  if (4 < (ulong)((long)local_78._end - (long)local_78._begin)) {
    fVar4 = merand48(&b->all->random_state);
    cn_00 = local_78._begin
            [(long)(fVar4 * (float)(ulong)((long)local_78._end - (long)local_78._begin >> 2)) &
             0xffffffff];
    local_9c = cn_00;
    if ((b->nodes)._begin[cn_00].internal == -1) {
      local_98.label = 0x3f800000;
      if (b->learn_at_leaf == 1) {
        learn_at_leaf_random(b,base,&local_9c,ec,(float *)&local_98);
      }
      if (b->oas == 1) {
        train_one_against_some_at_leaf(b,base,cn_00,ec);
      }
    }
    else {
      fVar4 = merand48(&b->all->random_state);
      fVar5 = (float)(ulong)((long)local_78._end - (long)local_78._begin >> 2);
      fVar5 = fVar5 / (fVar5 + -1.0);
      pnVar2 = (b->nodes)._begin;
      if (fVar4 < 0.5) {
        fVar5 = return_reward_from_node(b,base,pnVar2[cn_00].right,ec,fVar5);
        fVar4 = b->alpha;
        pnVar2 = (b->nodes)._begin;
        dVar3 = log(pnVar2[cn_00].nl / pnVar2[cn_00].nr);
        dVar3 = dVar3 * (1.0 - (double)fVar4) + (double)((fVar5 + fVar5) * b->alpha) * 0.5;
      }
      else {
        fVar5 = return_reward_from_node(b,base,pnVar2[cn_00].left,ec,fVar5);
        fVar4 = b->alpha;
        pnVar2 = (b->nodes)._begin;
        dVar3 = log(pnVar2[cn_00].nl / pnVar2[cn_00].nr);
        dVar3 = dVar3 * (1.0 - (double)fVar4) +
                ((double)fVar5 + (double)fVar5) * (double)b->alpha * -0.5;
      }
      ppVar1 = &ec->l;
      if (b->oas == 0) {
        unaff_RBP = ppVar1->multi;
      }
      else {
        local_98 = ppVar1->multi;
        pwStack_90 = (ec->l).cs.costs._end;
        local_88 = (ec->l).cs.costs.end_array;
        sStack_80 = (ec->l).cs.costs.erase_count;
        local_58 = (ec->pred).scalars._begin;
        pfStack_50 = (ec->pred).scalars._end;
        local_48 = (ec->pred).scalars.end_array;
        sStack_40 = (ec->pred).scalars.erase_count;
      }
      fVar4 = ec->weight;
      fVar5 = ABS((float)dVar3);
      ec->weight = fVar5;
      fVar6 = 100.0;
      if ((100.0 <= fVar5) || (fVar6 = 0.01, fVar5 < 0.01)) {
        ec->weight = fVar6;
      }
      (ec->l).simple.label = *(float *)(&DAT_00243360 + (ulong)((float)dVar3 < 0.0) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
      LEARNER::learner<char,_example>::learn(base,ec,(ulong)(b->nodes)._begin[cn_00].base_router);
      if (b->oas == 0) {
        ppVar1->multi = unaff_RBP;
      }
      else {
        (ec->pred).scalars.end_array = local_48;
        (ec->pred).scalars.erase_count = sStack_40;
        (ec->pred).scalars._begin = local_58;
        (ec->pred).scalars._end = pfStack_50;
        (ec->l).cs.costs.end_array = local_88;
        (ec->l).cs.costs.erase_count = sStack_80;
        ppVar1->multi = local_98;
        (ec->l).cs.costs._end = pwStack_90;
      }
      ec->weight = fVar4;
    }
  }
  v_array<unsigned_int>::delete_v(&local_78);
  return;
}

Assistant:

void single_query_and_learn(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, example& ec){
        v_array<uint32_t> path_to_leaf = v_init<uint32_t>();
		route_to_leaf(b, base, ec_array_index, 0, path_to_leaf, false); //no insertion happens here.

        if (path_to_leaf.size() > 1){
            //uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()-1);
            uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()); //include leaf
            uint32_t cn = path_to_leaf[random_pos];
            
            if (b.nodes[cn].internal != -1){ //if it's an internal node:' 
                float objective = 0.f;
                float prob_right = 0.5;
                float coin = merand48(b.all->random_state) < prob_right ? 1.f : -1.f;
                float weight = path_to_leaf.size()*1.f/(path_to_leaf.size() - 1.f);
                if (coin == -1.f){ //go left
                    float reward_left_subtree = return_reward_from_node(b,base, b.nodes[cn].left, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(-reward_left_subtree/(1.-prob_right))/2.;
                }
                else{ //go right:
                    float reward_right_subtree= return_reward_from_node(b,base, b.nodes[cn].right, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(reward_right_subtree/prob_right)/2.;
                }
                
                float ec_input_weight = ec.weight;
                
                MULTICLASS::label_t mc;
                MULTILABEL::labels multilabels;
                MULTILABEL::labels preds;
                if (b.oas == false)
                    mc = ec.l.multi;
                else{
                    multilabels = ec.l.multilabels;
                    preds = ec.pred.multilabels;
                }
                
                ec.weight = fabs(objective);
                if (ec.weight >= 100.f) //crop the weight, otherwise sometimes cause NAN outputs.
                    ec.weight = 100.f;
                else if (ec.weight < .01f)
                    ec.weight = 0.01f;
                ec.l.simple = {objective < 0. ? -1.f : 1.f, 1.f, 0.};
                base.learn(ec, b.nodes[cn].base_router);
               
                if (b.oas == false)
                    ec.l.multi = mc;
                else{
                    ec.pred.multilabels = preds;
                    ec.l.multilabels = multilabels;
                }
                ec.weight = ec_input_weight; //restore the original weight
            }
            else{ //if it's a leaf node:
                float weight = 1.f; //float(path_to_leaf.size());
                if (b.learn_at_leaf == true)
                    learn_at_leaf_random(b, base, cn, ec, weight); //randomly sample one example, query reward, and update leaf learner

                if (b.oas == true)
                    train_one_against_some_at_leaf(b,base, cn, ec);
            }
        }
        path_to_leaf.delete_v();
    }